

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_gethostbyname.c
# Opt level: O2

void ares_gethostbyname_callback(void *arg,int status,int timeouts,ares_addrinfo *result)

{
  undefined4 uVar1;
  size_t sVar2;
  apattern *paVar3;
  char *pcVar4;
  hostent *phVar5;
  ares_status_t aVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  undefined4 in_register_00000034;
  long lVar10;
  ulong uStack_90;
  hostent *hostent;
  ares_addrinfo *local_78;
  undefined8 *local_70;
  long local_68;
  undefined4 local_5c;
  ares_in6_addr a2;
  ares_in6_addr a1;
  
  hostent = (hostent *)0x0;
  uStack_90 = CONCAT44(in_register_00000034,status);
  if (status == 0) {
    aVar6 = ares_addrinfo2hostent(result,0,&hostent);
    phVar5 = hostent;
    if (hostent == (hostent *)0x0 || aVar6 != ARES_SUCCESS) {
      uStack_90 = (ulong)aVar6;
      if (aVar6 != ARES_SUCCESS) goto LAB_00110437;
    }
    else {
      uStack_90 = 1;
      if ((hostent->h_addr_list == (char **)0x0) ||
         (uStack_90 = 1, *hostent->h_addr_list == (char *)0x0)) goto LAB_00110437;
    }
    sVar2 = *(size_t *)(*(long *)((long)arg + 0x10) + 0x50);
    local_78 = result;
    local_70 = (undefined8 *)arg;
    if (sVar2 == 0 || hostent == (hostent *)0x0) {
      uStack_90 = 0;
    }
    else {
      iVar9 = hostent->h_addrtype;
      if (iVar9 == 10) {
        paVar3 = *(apattern **)(*(long *)((long)arg + 0x10) + 0x48);
        lVar10 = 0;
        while (pcVar4 = phVar5->h_addr_list[lVar10], pcVar4 != (char *)0x0) {
          a1._S6_un._0_8_ = *(undefined8 *)pcVar4;
          a1._S6_un._8_8_ = *(undefined8 *)(pcVar4 + 8);
          sVar7 = get6_address_index(&a1,paVar3,sVar2);
          local_68 = lVar10;
          for (; 0 < lVar10; lVar10 = lVar10 + -1) {
            a2._S6_un._0_8_ = *(undefined8 *)phVar5->h_addr_list[lVar10 + -1];
            a2._S6_un._8_8_ = *(undefined8 *)(phVar5->h_addr_list[lVar10 + -1] + 8);
            sVar8 = get6_address_index(&a2,paVar3,sVar2);
            if (sVar8 <= sVar7) goto LAB_00110565;
            pcVar4 = phVar5->h_addr_list[lVar10];
            *(undefined8 *)pcVar4 = a2._S6_un._0_8_;
            *(undefined8 *)(pcVar4 + 8) = a2._S6_un._8_8_;
          }
          lVar10 = 0;
LAB_00110565:
          pcVar4 = phVar5->h_addr_list[(int)lVar10];
          *(undefined8 *)pcVar4 = a1._S6_un._0_8_;
          *(undefined8 *)(pcVar4 + 8) = a1._S6_un._8_8_;
          lVar10 = local_68 + 1;
        }
        iVar9 = hostent->h_addrtype;
      }
      phVar5 = hostent;
      if (iVar9 == 2) {
        paVar3 = *(apattern **)(local_70[2] + 0x48);
        sVar2 = *(size_t *)(local_70[2] + 0x50);
        lVar10 = 0;
        while (phVar5->h_addr_list[lVar10] != (char *)0x0) {
          local_5c = *(undefined4 *)phVar5->h_addr_list[lVar10];
          a1._S6_un._0_4_ = local_5c;
          sVar7 = get_address_index((in_addr *)&a1,paVar3,sVar2);
          local_68 = lVar10;
          for (; 0 < lVar10; lVar10 = lVar10 + -1) {
            uVar1 = *(undefined4 *)phVar5->h_addr_list[lVar10 + -1];
            a2._S6_un._0_4_ = uVar1;
            sVar8 = get_address_index((in_addr *)&a2,paVar3,sVar2);
            if (sVar8 <= sVar7) goto LAB_0011062f;
            *(undefined4 *)phVar5->h_addr_list[lVar10] = uVar1;
          }
          lVar10 = 0;
LAB_0011062f:
          *(undefined4 *)phVar5->h_addr_list[(int)lVar10] = local_5c;
          lVar10 = local_68 + 1;
        }
      }
      uStack_90 = 0;
      result = local_78;
      arg = local_70;
    }
  }
LAB_00110437:
  (**arg)(*(undefined8 *)((long)arg + 8),uStack_90,timeouts,hostent);
  ares_freeaddrinfo(result);
  ares_free(arg);
  ares_free_hostent(hostent);
  return;
}

Assistant:

static void ares_gethostbyname_callback(void *arg, int status, int timeouts,
                                        struct ares_addrinfo *result)
{
  struct hostent    *hostent  = NULL;
  struct host_query *ghbn_arg = arg;

  if (status == ARES_SUCCESS) {
    status = (int)ares_addrinfo2hostent(result, AF_UNSPEC, &hostent);
  }

  /* addrinfo2hostent will only return ENODATA if there are no addresses _and_
   * no cname/aliases.  However, gethostbyname will return ENODATA even if there
   * is cname/alias data */
  if (status == ARES_SUCCESS && hostent &&
      (!hostent->h_addr_list || !hostent->h_addr_list[0])) {
    status = ARES_ENODATA;
  }

  if (status == ARES_SUCCESS && ghbn_arg->channel->nsort && hostent) {
    if (hostent->h_addrtype == AF_INET6) {
      sort6_addresses(hostent, ghbn_arg->channel->sortlist,
                      ghbn_arg->channel->nsort);
    }
    if (hostent->h_addrtype == AF_INET) {
      sort_addresses(hostent, ghbn_arg->channel->sortlist,
                     ghbn_arg->channel->nsort);
    }
  }

  ghbn_arg->callback(ghbn_arg->arg, status, timeouts, hostent);

  ares_freeaddrinfo(result);
  ares_free(ghbn_arg);
  ares_free_hostent(hostent);
}